

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [4])

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint hash;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  size_t extraout_RDX;
  ulong uVar9;
  StringPtr str;
  StringPtr local_58;
  StringPtr local_48;
  undefined8 local_38;
  
  if (*(long *)(this + 0x38) == 0) {
    return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)0x0;
  }
  lVar3 = *(long *)this;
  sVar7 = strlen(*params);
  str.content.size_ = extraout_RDX;
  str.content.ptr = (char *)(sVar7 + 1);
  hash = _::anon_unknown_0::StringHasher::hashCode((StringHasher *)params,str);
  uVar6 = _::chooseBucket(hash,*(uint *)(this + 0x38));
  do {
    uVar9 = (ulong)uVar6;
    lVar4 = *(long *)(this + 0x30);
    iVar2 = *(int *)(lVar4 + 4 + uVar9 * 8);
    if (iVar2 == 0) {
      return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)0x0;
    }
    if ((iVar2 != 1) && (*(uint *)(lVar4 + uVar9 * 8) == hash)) {
      lVar8 = (ulong)(iVar2 - 2) * 0x18;
      local_38 = *(undefined8 *)(lVar3 + 0x10 + lVar8);
      puVar1 = (undefined8 *)(lVar3 + lVar8);
      local_48.content.ptr = (char *)*puVar1;
      local_48.content.size_ = puVar1[1];
      sVar7 = strlen(*params);
      local_58.content.size_ = sVar7 + 1;
      local_58.content.ptr = *params;
      bVar5 = StringPtr::operator==(&local_48,&local_58);
      if (bVar5) {
        return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)
               (SiPair *)((ulong)(*(int *)(lVar4 + 4 + uVar9 * 8) - 2) * 0x18 + *(long *)this);
      }
    }
    uVar6 = 0;
    if (uVar9 + 1 != *(long *)(this + 0x38)) {
      uVar6 = (uint)(uVar9 + 1);
    }
  } while( true );
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }